

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O0

int __thiscall OpenMD::SlabStatistics::getBin(SlabStatistics *this,Vector3d *pos)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  Vector3d *in_stack_00000048;
  Snapshot *in_stack_00000050;
  
  Snapshot::wrapVector(in_stack_00000050,in_stack_00000048);
  uVar2 = *(uint *)(in_RDI + 0x34);
  pdVar3 = Vector<double,_3U>::operator[](in_RSI,*(uint *)(in_RDI + 0x760));
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x710),*(uint *)(in_RDI + 0x760),
                      *(uint *)(in_RDI + 0x760));
  return (uint)(int)((double)uVar2 * (dVar1 / *pdVar3 + 0.5)) % *(uint *)(in_RDI + 0x34);
}

Assistant:

int SlabStatistics::getBin(Vector3d pos) {
    currentSnapshot_->wrapVector(pos);
    // which bin is this stuntdouble in?
    // wrapped positions are in the range [-0.5*hmat(2,2), +0.5*hmat(2,2)]
    // Shift molecules by half a box to have bins start at 0
    // The modulo operator is used to wrap the case when we are
    // beyond the end of the bins back to the beginning.
    return int(nBins_ * (pos[axis_] / hmat_(axis_, axis_) + 0.5)) % nBins_;
  }